

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

size_t __thiscall v_array<node_pred>::unique_add_sorted(v_array<node_pred> *this,node_pred *new_ele)

{
  node_pred *pnVar1;
  node_pred *pnVar2;
  node_pred *pnVar3;
  uint32_t uVar4;
  float fVar5;
  size_t sVar6;
  long lVar7;
  
  pnVar1 = this->_end;
  pnVar2 = this->_begin;
  sVar6 = find_sorted(this,new_ele);
  pnVar3 = this->_begin;
  if ((sVar6 == ((long)this->_end - (long)pnVar3 >> 3) * -0x5555555555555555) ||
     (pnVar3[sVar6].label != new_ele->label)) {
    if (this->_end == this->end_array) {
      resize(this,((long)this->end_array - (long)pnVar3 >> 3) * 0x5555555555555556 + 3);
    }
    lVar7 = ((long)pnVar1 - (long)pnVar2 >> 3) * -0x5555555555555555 - sVar6;
    if (lVar7 != 0) {
      memmove(this->_begin + sVar6 + 1,this->_begin + sVar6,lVar7 * 0x18);
    }
    pnVar1 = this->_begin;
    uVar4 = new_ele->label_count;
    pnVar2 = pnVar1 + sVar6;
    pnVar2->label = new_ele->label;
    pnVar2->label_count = uVar4;
    fVar5 = new_ele->norm_Ehk;
    uVar4 = new_ele->nk;
    pnVar1 = pnVar1 + sVar6;
    pnVar1->Ehk = new_ele->Ehk;
    pnVar1->norm_Ehk = fVar5;
    pnVar1->nk = uVar4;
    this->_end = this->_end + 1;
  }
  return sVar6;
}

Assistant:

size_t unique_add_sorted(const T& new_ele)
  {
    size_t index = 0;
    size_t size = _end - _begin;
    size_t to_move;

    if (!contain_sorted(new_ele, index))
    {
      if (_end == end_array)
        resize(2 * (end_array - _begin) + 3);

      to_move = size - index;

      if (to_move > 0)
        memmove(_begin + index + 1, _begin + index,
            to_move * sizeof(T));  // kopiuje to_move*.. bytow z _begin+index do _begin+index+1

      _begin[index] = new_ele;

      _end++;
    }

    return index;
  }